

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O3

void __thiscall MuxerManager::muxBlockFinished(MuxerManager *this,AbstractMuxer *muxer)

{
  pointer pWVar1;
  WriterData *i;
  pointer pWVar2;
  
  if (this->m_subMuxer == muxer) {
    this->m_subBlockFinished = true;
  }
  else {
    this->m_mainBlockFinished = true;
    if ((this->m_subBlockFinished & 1U) == 0) {
      return;
    }
  }
  if (this->m_mainBlockFinished == true) {
    pWVar2 = (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pWVar1 = (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pWVar2 != pWVar1) {
      do {
        asyncWriteBlock(this,pWVar2);
        pWVar2 = pWVar2 + 1;
      } while (pWVar2 != pWVar1);
      pWVar2 = (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>._M_impl.
          super__Vector_impl_data._M_finish != pWVar2) {
        (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>._M_impl.
        super__Vector_impl_data._M_finish = pWVar2;
      }
    }
    this->m_subBlockFinished = false;
    this->m_mainBlockFinished = false;
  }
  return;
}

Assistant:

void MuxerManager::muxBlockFinished(const AbstractMuxer* muxer)
{
    if (muxer == m_subMuxer)
        m_subBlockFinished = true;
    else
        m_mainBlockFinished = true;

    if (m_subBlockFinished && m_mainBlockFinished)
    {
        for (auto& i : m_delayedData) asyncWriteBlock(i);

        m_delayedData.clear();
        m_subBlockFinished = false;
        m_mainBlockFinished = false;
    }
}